

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_obj_motion.cxx
# Opt level: O0

bool __thiscall xray_re::xr_obj_motion::load_anm(xr_obj_motion *this,char *path)

{
  xr_reader *local_38;
  xr_reader *s;
  xr_reader *r;
  xr_file_system *fs;
  char *path_local;
  xr_obj_motion *this_local;
  
  fs = (xr_file_system *)path;
  path_local = (char *)this;
  r = (xr_reader *)xr_file_system::instance();
  s = xr_file_system::r_open((xr_file_system *)r,(char *)fs);
  if (s == (xr_reader *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    local_38 = xr_reader::open_chunk(s,0x1100);
    if (local_38 == (xr_reader *)0x0) {
      __assert_fail("s",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_obj_motion.cxx"
                    ,0x42,"bool xray_re::xr_obj_motion::load_anm(const char *)");
    }
    (*(this->super_xr_motion)._vptr_xr_motion[2])(this,local_38);
    xr_reader::close_chunk(s,&local_38);
    xr_file_system::r_close((xr_file_system *)r,&s);
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool xr_obj_motion::load_anm(const char* path)
{
	xr_file_system& fs = xr_file_system::instance();
	xr_reader* r = fs.r_open(path);
	if (r == 0)
		return false;
	xr_reader* s = r->open_chunk(EOBJ_CHUNK_OMOTION);
	xr_assert(s);
	load(*s);
	r->close_chunk(s);
	fs.r_close(r);
	return true;
}